

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall
wabt::WastLexer::TextToken
          (Token *__return_storage_ptr__,WastLexer *this,TokenType token_type,size_t offset)

{
  Location loc;
  undefined8 uVar1;
  undefined8 uVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  string_view text;
  undefined4 uStack_c;
  
  uVar1 = (this->filename_)._M_dataplus;
  uVar2 = (this->filename_)._M_string_length;
  loc.filename.size_ = uVar2;
  loc.filename.data_ = (char *)uVar1;
  iVar5 = ((int)this->token_start_ - *(int *)&this->line_start_) + 1;
  if (iVar5 < 2) {
    iVar5 = 1;
  }
  iVar4 = ((int)this->cursor_ - *(int *)&this->line_start_) + 1;
  if (iVar4 < 2) {
    iVar4 = 1;
  }
  pcVar3 = this->token_start_ + offset;
  loc.field_1.field_0.first_column = iVar5;
  loc.field_1.field_0.line = this->line_;
  loc.field_1._12_4_ = uStack_c;
  loc.field_1.field_0.last_column = iVar4;
  text.size_ = (long)this->cursor_ - (long)pcVar3;
  text.data_ = pcVar3;
  Token::Token(__return_storage_ptr__,loc,token_type,text);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::TextToken(TokenType token_type, size_t offset) {
  return Token(GetLocation(), token_type, GetText(offset));
}